

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
::_reduce_last_column
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
           *this,Index lastIndex)

{
  node_ptr plVar1;
  Dimension dim;
  Column *pCVar2;
  
  pCVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
           ::_get_column(&this->reducedMatrixR_,lastIndex);
  plVar1 = (pCVar2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar1 == (node_ptr)0x0 || plVar1 == (node_ptr)&pCVar2->column_) {
    dim = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
          ::get_column_dimension(&this->reducedMatrixR_,lastIndex);
    RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>_>
    ::_add_bar(&this->super_RU_pairing_option,dim,this->nextEventIndex_);
    return;
  }
  _reduce_column(this,lastIndex,this->nextEventIndex_);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_last_column(Index lastIndex)
{
  if (reducedMatrixR_.get_column(lastIndex).is_empty()) {
    _add_bar(get_column_dimension(lastIndex), nextEventIndex_);
    return;
  }

  _reduce_column(lastIndex, nextEventIndex_);
}